

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O3

IterateResult __thiscall dit::FuzzyComparisonMetricCase::iterate(FuzzyComparisonMetricCase *this)

{
  TextureFormat TVar1;
  TextureFormat TVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Archive *pAVar5;
  pointer pcVar6;
  TestLog *pTVar7;
  bool bVar8;
  bool bVar9;
  deUint64 dVar10;
  LogNumber<float> *access;
  ConstPixelBufferAccess *pCVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int __fd;
  TextureLevel refImg;
  TextureLevel errorMask;
  TextureLevel cmpImg;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  FuzzyCompareParams local_3f4;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  undefined1 local_390 [40];
  undefined1 local_368 [40];
  undefined1 local_340 [96];
  qpKeyValueTag local_2e0;
  deInt64 local_2d8;
  undefined1 local_2b0 [96];
  qpKeyValueTag local_250;
  float local_24c;
  deUint64 local_220;
  deUint64 local_218;
  undefined1 local_210 [96];
  qpKeyValueTag local_1b0;
  float local_1ac;
  TextureLevel local_180;
  string local_158;
  string local_138;
  string local_118;
  float local_f8;
  TextureLevel local_e8;
  TextureLevel local_c0;
  LogNumber<float> local_98;
  
  tcu::TextureLevel::TextureLevel(&local_180);
  tcu::TextureLevel::TextureLevel(&local_c0);
  tcu::TextureLevel::TextureLevel(&local_e8);
  local_3f4.maxSampleSkip = 0;
  pAVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive;
  TVar1 = (TextureFormat)((long)local_210 + 0x10);
  local_210._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"internal/data/imagecompare","");
  TVar2 = (TextureFormat)((long)local_2b0 + 0x10);
  pcVar6 = (this->m_refImg)._M_dataplus._M_p;
  local_2b0._0_8_ = TVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b0,pcVar6,pcVar6 + (this->m_refImg)._M_string_length);
  de::FilePath::join((FilePath *)local_340,(FilePath *)local_210,(FilePath *)local_2b0);
  tcu::ImageIO::loadImage(&local_180,pAVar5,(char *)local_340._0_8_);
  if (local_340._0_8_ != (long)local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  if ((TextureFormat)local_2b0._0_8_ != TVar2) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if ((TextureFormat)local_210._0_8_ != TVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  pAVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive;
  local_210._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"internal/data/imagecompare","");
  pcVar6 = (this->m_cmpImg)._M_dataplus._M_p;
  local_2b0._0_8_ = TVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b0,pcVar6,pcVar6 + (this->m_cmpImg)._M_string_length);
  de::FilePath::join((FilePath *)local_340,(FilePath *)local_210,(FilePath *)local_2b0);
  tcu::ImageIO::loadImage(&local_c0,pAVar5,(char *)local_340._0_8_);
  if (local_340._0_8_ != (long)local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  if ((TextureFormat)local_2b0._0_8_ != TVar2) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if ((TextureFormat)local_210._0_8_ != TVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  local_340._0_4_ = local_180.m_format.order;
  local_340._4_4_ = local_180.m_format.type;
  tcu::TextureLevel::setStorage
            (&local_e8,(TextureFormat *)local_340,local_180.m_size.m_data[0],
             local_180.m_size.m_data[1],local_180.m_size.m_data[2]);
  dVar10 = deGetMicroseconds();
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_340,&local_180);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_210,&local_c0)
  ;
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_2b0,&local_e8);
  local_f8 = tcu::fuzzyCompare(&local_3f4,(ConstPixelBufferAccess *)local_340,
                               (ConstPixelBufferAccess *)local_210,(PixelBufferAccess *)local_2b0);
  local_220 = deGetMicroseconds();
  pTVar7 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  paVar3 = &local_3d0.field_2;
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  local_218 = dVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"RefImage","");
  paVar4 = &local_3f0.field_2;
  local_3f0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Reference Image","");
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&local_98,&local_180);
  access = &local_98;
  tcu::LogImage::LogImage
            ((LogImage *)local_340,&local_3d0,&local_3f0,(ConstPixelBufferAccess *)access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  __fd = (int)pTVar7;
  tcu::LogImage::write((LogImage *)local_340,__fd,__buf,(size_t)access);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"CmpImage","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Compare Image","");
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_368,&local_c0)
  ;
  pCVar11 = (ConstPixelBufferAccess *)local_368;
  tcu::LogImage::LogImage
            ((LogImage *)local_210,&local_418,&local_438,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_210,__fd,__buf_00,(size_t)pCVar11);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"ErrorMask","");
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"Error Mask","");
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_390,&local_e8)
  ;
  pCVar11 = (ConstPixelBufferAccess *)local_390;
  tcu::LogImage::LogImage
            ((LogImage *)local_2b0,&local_458,&local_478,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_2b0,__fd,__buf_01,(size_t)pCVar11);
  if ((undefined1 *)local_2b0._32_8_ != local_2b0 + 0x30) {
    operator_delete((void *)local_2b0._32_8_,local_2b0._48_8_ + 1);
  }
  if ((TextureFormat)local_2b0._0_8_ != TVar2) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_210._32_8_ != local_210 + 0x30) {
    operator_delete((void *)local_210._32_8_,local_210._48_8_ + 1);
  }
  if ((TextureFormat)local_210._0_8_ != TVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_340._32_8_ != local_340 + 0x30) {
    operator_delete((void *)local_340._32_8_,local_340._48_8_ + 1);
  }
  if (local_340._0_8_ != (long)local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar4) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  pTVar7 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_368._0_8_ = (long)local_368 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"Result","");
  local_390._0_8_ = (long)local_390 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"Result metric","");
  local_3d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_210,(string *)local_368,(string *)local_390,&local_3d0,
             QP_KEY_TAG_NONE,local_f8);
  tcu::TestLog::writeFloat
            (pTVar7,(char *)local_210._0_8_,(char *)local_210._32_8_,(char *)local_210._64_8_,
             local_1b0,local_1ac);
  local_3f0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"MinBound","");
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Minimum bound","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"");
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_2b0,&local_3f0,&local_418,&local_438,QP_KEY_TAG_NONE,
             this->m_minBound);
  tcu::TestLog::writeFloat
            (pTVar7,(char *)local_2b0._0_8_,(char *)local_2b0._32_8_,(char *)local_2b0._64_8_,
             local_250,local_24c);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"MaxBound","");
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"Maximum bound","");
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  tcu::LogNumber<float>::LogNumber
            (&local_98,&local_458,&local_478,&local_3b0,QP_KEY_TAG_NONE,this->m_maxBound);
  tcu::TestLog::writeFloat
            (pTVar7,local_98.m_name._M_dataplus._M_p,local_98.m_desc._M_dataplus._M_p,
             local_98.m_unit._M_dataplus._M_p,local_98.m_tag,local_98.m_value);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CompareTime","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Comparison time","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"us","");
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_340,&local_118,&local_138,&local_158,QP_KEY_TAG_TIME,
             local_220 - local_218);
  tcu::TestLog::writeInteger
            (pTVar7,(char *)local_340._0_8_,(char *)local_340._32_8_,(char *)local_340._64_8_,
             local_2e0,local_2d8);
  if (local_340._64_8_ != (long)local_340 + 0x50) {
    operator_delete((void *)local_340._64_8_,local_340._80_8_ + 1);
  }
  if ((undefined1 *)local_340._32_8_ != local_340 + 0x30) {
    operator_delete((void *)local_340._32_8_,local_340._48_8_ + 1);
  }
  if (local_340._0_8_ != (long)local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_unit._M_dataplus._M_p != &local_98.m_unit.field_2) {
    operator_delete(local_98.m_unit._M_dataplus._M_p,
                    local_98.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_desc._M_dataplus._M_p != &local_98.m_desc.field_2) {
    operator_delete(local_98.m_desc._M_dataplus._M_p,
                    local_98.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_name._M_dataplus._M_p != &local_98.m_name.field_2) {
    operator_delete(local_98.m_name._M_dataplus._M_p,
                    local_98.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0._64_8_ != (long)local_2b0 + 0x50) {
    operator_delete((void *)local_2b0._64_8_,local_2b0._80_8_ + 1);
  }
  if ((undefined1 *)local_2b0._32_8_ != local_2b0 + 0x30) {
    operator_delete((void *)local_2b0._32_8_,local_2b0._48_8_ + 1);
  }
  if (local_2b0._0_8_ != (long)local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if (local_210._64_8_ != (long)local_210 + 0x50) {
    operator_delete((void *)local_210._64_8_,local_210._80_8_ + 1);
  }
  if ((undefined1 *)local_210._32_8_ != local_210 + 0x30) {
    operator_delete((void *)local_210._32_8_,local_210._48_8_ + 1);
  }
  if ((TextureFormat)local_210._0_8_ != TVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if (local_390._0_8_ != (long)local_390 + 0x10) {
    operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
  }
  if (local_368._0_8_ != (long)local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
  }
  bVar8 = local_f8 < this->m_minBound;
  bVar9 = this->m_maxBound < local_f8;
  description = "Pass";
  if (bVar8 || bVar9) {
    description = "Metric out of bounds";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(bVar8 || bVar9),description);
  tcu::TextureLevel::~TextureLevel(&local_e8);
  tcu::TextureLevel::~TextureLevel(&local_c0);
  tcu::TextureLevel::~TextureLevel(&local_180);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		tcu::TextureLevel		refImg;
		tcu::TextureLevel		cmpImg;
		tcu::TextureLevel		errorMask;
		tcu::FuzzyCompareParams	params;
		float					result		= 0.0f;
		deUint64				compareTime	= 0;

		params.maxSampleSkip = 0;

		tcu::ImageIO::loadImage(refImg, m_testCtx.getArchive(), de::FilePath::join(BASE_DIR, m_refImg).getPath());
		tcu::ImageIO::loadImage(cmpImg, m_testCtx.getArchive(), de::FilePath::join(BASE_DIR, m_cmpImg).getPath());

		errorMask.setStorage(refImg.getFormat(), refImg.getWidth(), refImg.getHeight(), refImg.getDepth());

		{
			const deUint64 startTime = deGetMicroseconds();
			result = tcu::fuzzyCompare(params, refImg, cmpImg, errorMask);
			compareTime = deGetMicroseconds()-startTime;
		}

		m_testCtx.getLog() << TestLog::Image("RefImage",	"Reference Image",	refImg)
						   << TestLog::Image("CmpImage",	"Compare Image",	cmpImg)
						   << TestLog::Image("ErrorMask",	"Error Mask",		errorMask);

		m_testCtx.getLog() << TestLog::Float("Result", "Result metric", "", QP_KEY_TAG_NONE, result)
						   << TestLog::Float("MinBound", "Minimum bound", "", QP_KEY_TAG_NONE, m_minBound)
						   << TestLog::Float("MaxBound", "Maximum bound", "", QP_KEY_TAG_NONE, m_maxBound)
						   << TestLog::Integer("CompareTime", "Comparison time", "us", QP_KEY_TAG_TIME, compareTime);

		{
			const bool isOk = de::inRange(result, m_minBound, m_maxBound);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Metric out of bounds");
		}

		return STOP;
	}